

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# live.cc
# Opt level: O0

void __thiscall
pstack::Procman::LiveProcess::LiveProcess
          (LiveProcess *this,Context *context,sptr *ex,pid_t pid_,bool alreadyStopped)

{
  sptr *psVar1;
  bool bVar2;
  mapped_type *pmVar3;
  shared_ptr<pstack::Procman::LiveReader> local_c8;
  shared_ptr<pstack::CacheReader> local_b8;
  shared_ptr<pstack::Reader> local_a8;
  byte local_97;
  byte local_96;
  byte local_95;
  byte local_82;
  allocator<char> local_81;
  string local_80 [32];
  string local_60 [39];
  byte local_39;
  shared_ptr<pstack::Elf::Object> local_38;
  byte local_25;
  char local_24 [4];
  bool alreadyStopped_local;
  sptr *psStack_20;
  pid_t pid__local;
  sptr *ex_local;
  Context *context_local;
  LiveProcess *this_local;
  
  local_25 = alreadyStopped;
  local_24 = (char  [4])pid_;
  psStack_20 = ex;
  ex_local = (sptr *)context;
  context_local = (Context *)this;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)ex);
  psVar1 = ex_local;
  local_39 = 0;
  local_82 = 0;
  local_95 = 0;
  local_96 = 0;
  local_97 = 0;
  if (bVar2) {
    std::shared_ptr<pstack::Elf::Object>::shared_ptr(&local_38,psStack_20);
    local_39 = 1;
  }
  else {
    std::allocator<char>::allocator();
    local_82 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_80,"exe",&local_81);
    local_95 = 1;
    pstack::Context::procname((int)local_60,(string *)psVar1);
    local_96 = 1;
    pstack::Context::getImageForName((string *)&local_38,SUB81(psVar1,0));
    local_97 = 1;
  }
  std::make_shared<pstack::Procman::LiveReader,pstack::Context&,int&,char_const(&)[4]>
            ((Context *)&local_c8,(int *)ex_local,&local_24);
  std::make_shared<pstack::CacheReader,std::shared_ptr<pstack::Procman::LiveReader>>
            ((shared_ptr<pstack::Procman::LiveReader> *)&local_b8);
  std::shared_ptr<pstack::Reader>::shared_ptr<pstack::CacheReader,void>(&local_a8,&local_b8);
  Process::Process(&this->super_Process,context,&local_38,&local_a8);
  std::shared_ptr<pstack::Reader>::~shared_ptr(&local_a8);
  std::shared_ptr<pstack::CacheReader>::~shared_ptr(&local_b8);
  std::shared_ptr<pstack::Procman::LiveReader>::~shared_ptr(&local_c8);
  if ((local_97 & 1) != 0) {
    std::shared_ptr<pstack::Elf::Object>::~shared_ptr(&local_38);
  }
  if ((local_96 & 1) != 0) {
    std::__cxx11::string::~string(local_60);
  }
  if ((local_95 & 1) != 0) {
    std::__cxx11::string::~string(local_80);
  }
  if ((local_82 & 1) != 0) {
    std::allocator<char>::~allocator(&local_81);
  }
  if ((local_39 & 1) != 0) {
    std::shared_ptr<pstack::Elf::Object>::~shared_ptr(&local_38);
  }
  (this->super_Process)._vptr_Process = (_func_int **)&PTR_findRDebugAddr_001f7240;
  this->pid = (pid_t)local_24;
  std::
  map<int,_pstack::Procman::LiveProcess::Lwp,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Procman::LiveProcess::Lwp>_>_>
  ::map(&this->stoppedLWPs);
  ps_getpid((ps_prochandle *)this);
  if ((local_25 & 1) != 0) {
    pmVar3 = std::
             map<int,_pstack::Procman::LiveProcess::Lwp,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Procman::LiveProcess::Lwp>_>_>
             ::operator[](&this->stoppedLWPs,&this->pid);
    pmVar3->stopCount = 1;
  }
  return;
}

Assistant:

LiveProcess::LiveProcess(Context &context, Elf::Object::sptr &ex, pid_t pid_, bool alreadyStopped)
    : Process(
            context,
            ex ? ex : context.getImageForName(context.procname(pid_, "exe")),
            std::make_shared<CacheReader>(std::make_shared<LiveReader>(context, pid_, "mem")))
    , pid(pid_)
{
    (void)ps_getpid(this);
    if (alreadyStopped)
       stoppedLWPs[pid].stopCount = 1;
}